

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsDemuxer.cpp
# Opt level: O0

void __thiscall TSDemuxer::openFile(TSDemuxer *this,string *streamName)

{
  AbstractReader *pAVar1;
  bool bVar2;
  uint uVar3;
  undefined8 uVar4;
  ostream *poVar5;
  VodCoreException *this_00;
  string local_200;
  ostringstream local_1e0 [8];
  ostringstream ss;
  string local_58;
  string local_38;
  string *local_18;
  string *streamName_local;
  TSDemuxer *this_local;
  
  local_18 = streamName;
  streamName_local = (string *)this;
  std::__cxx11::string::operator=((string *)&this->m_streamName,(string *)streamName);
  unquoteStr(&local_58,local_18);
  strToLowerCase(&local_38,&local_58);
  std::__cxx11::string::operator=((string *)&this->m_streamNameLow,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  readClose(this);
  std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::clear
            (&this->m_lastPesPts);
  std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::clear
            (&this->m_lastPesDts);
  std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::clear
            (&this->m_fullPtsTime);
  std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::clear
            (&this->m_fullDtsTime);
  std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::clear
            (&this->m_firstPtsTime);
  std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::clear
            (&this->m_firstDtsTime);
  this->m_firstPCRTime = -1;
  this->m_lastPCRVal = -1;
  bVar2 = isM2TSExt(local_18);
  this->m_m2tsMode = bVar2;
  pAVar1 = this->m_bufferedReader;
  uVar3 = this->m_readerID;
  uVar4 = std::__cxx11::string::c_str();
  uVar3 = (*pAVar1->_vptr_AbstractReader[8])(pAVar1,(ulong)uVar3,uVar4,0,0);
  if ((uVar3 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    poVar5 = std::operator<<((ostream *)local_1e0,"Can\'t open stream ");
    std::operator<<(poVar5,(string *)&this->m_streamName);
    this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(this_00,100,&local_200);
    __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  this->m_pmtPid = -1;
  this->m_codecReady = false;
  this->m_readCnt = 0;
  this->m_dataProcessed = 0;
  this->m_notificated = false;
  return;
}

Assistant:

void TSDemuxer::openFile(const std::string& streamName)
{
    m_streamName = streamName;
    m_streamNameLow = strToLowerCase(unquoteStr(streamName));
    readClose();
    m_lastPesPts.clear();
    m_lastPesDts.clear();
    m_fullPtsTime.clear();
    m_fullDtsTime.clear();
    m_firstPtsTime.clear();
    m_firstDtsTime.clear();
    m_firstPCRTime = -1;
    m_lastPCRVal = -1;

    m_m2tsMode = isM2TSExt(streamName);

    if (!m_bufferedReader->openStream(m_readerID, m_streamName.c_str()))
        THROW(ERR_FILE_NOT_FOUND, "Can't open stream " << m_streamName)

    m_pmtPid = -1;
    m_codecReady = false;
    m_readCnt = 0;
    m_dataProcessed = 0;
    m_notificated = false;
}